

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall r_code::SysView::SysView(SysView *this,View *source)

{
  Atom *a;
  Atom *this_00;
  ulong local_38;
  size_t i_1;
  ulong local_20;
  size_t i;
  View *source_local;
  SysView *this_local;
  
  ImageObject::ImageObject(&this->super_ImageObject);
  (this->super_ImageObject)._vptr_ImageObject = (_func_int **)&PTR__SysView_0011bc28;
  for (local_20 = 0; local_20 < 0xd; local_20 = local_20 + 1) {
    a = View::code(source,(uint16_t)local_20);
    this_00 = vector<r_code::Atom>::operator[](&(this->super_ImageObject).code,local_20);
    Atom::operator=(this_00,a);
  }
  for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
    if (*(long *)(source + local_38 * 8 + 0x10) != 0) {
      vector<unsigned_int>::push_back(&(this->super_ImageObject).references,0);
    }
  }
  return;
}

Assistant:

SysView::SysView(View *source)
{
    for (size_t i = 0; i < VIEW_CODE_MAX_SIZE; ++i) {
        code[i] = source->code(i);
    }

    for (size_t i = 0; i < 2; ++i) // to get the right size in Image::add_object().
        if (source->references[i]) {
            references.push_back(0);
        }
}